

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O1

int ObsNumLastMoves(pyhanabi_observation_t *observation)

{
  void *pvVar1;
  
  if (observation == (pyhanabi_observation_t *)0x0) {
    __assert_fail("observation != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x2dc,"int ObsNumLastMoves(pyhanabi_observation_t *)");
  }
  pvVar1 = observation->observation;
  if (pvVar1 != (void *)0x0) {
    return (int)((ulong)(*(long *)((long)pvVar1 + 0x60) - *(long *)((long)pvVar1 + 0x58)) >> 4);
  }
  __assert_fail("observation->observation != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x2dd,"int ObsNumLastMoves(pyhanabi_observation_t *)");
}

Assistant:

int ObsNumLastMoves(pyhanabi_observation_t* observation) {
  REQUIRE(observation != nullptr);
  REQUIRE(observation->observation != nullptr);
  return reinterpret_cast<hanabi_learning_env::HanabiObservation*>(
             observation->observation)
      ->LastMoves()
      .size();
}